

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O1

int32_t __thiscall icu_63::CollationKey::hashCode(CollationKey *this)

{
  uint uVar1;
  uint uVar2;
  StackBufferOrFields *str;
  
  if (this->fHashCode == 0) {
    if (this->fFlagAndLength < 0) {
      str = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
    }
    else {
      str = &this->fUnion;
    }
    uVar2 = this->fFlagAndLength & 0x7fffffff;
    uVar1 = 1;
    if (uVar2 != 0 && str != (StackBufferOrFields *)0x0) {
      uVar2 = ustr_hashCharsN_63((char *)str->fStackBuffer,uVar2);
      uVar1 = 1;
      if ((uVar2 & 0xfffffffd) != 0) {
        uVar1 = uVar2;
      }
    }
    this->fHashCode = uVar1;
  }
  return this->fHashCode;
}

Assistant:

int32_t
CollationKey::hashCode() const
{
    // (Cribbed from UnicodeString)
    // We cache the hashCode; when it becomes invalid, due to any change to the
    // string, we note this by setting it to kInvalidHashCode. [LIU]

    // Note: This method is semantically const, but physically non-const.

    if (fHashCode == kInvalidHashCode)
    {
        fHashCode = computeHashCode(getBytes(), getLength());
    }

    return fHashCode;
}